

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

int parse_args_DCL(Context_conflict2 *ctx)

{
  RegisterType RVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  int *piVar5;
  uint uVar6;
  uint32 uVar7;
  ulong uVar8;
  long lVar9;
  uint32 index;
  uint32 local_2c;
  
  uVar8 = 0;
  local_2c = 0;
  ctx->tokenbufpos = ctx->tokenbufpos + 1;
  ctx->tokenbuf[0] = 0;
  piVar5 = &parse_dcl_usage_usagestrs_rel;
  do {
    iVar3 = check_token_segment(ctx,(char *)((long)&parse_dcl_usage_usagestrs_rel + (long)*piVar5));
    if (iVar3 != 0) {
      bVar4 = false;
      goto LAB_001508ec;
    }
    uVar8 = uVar8 + 1;
    piVar5 = piVar5 + 1;
  } while (uVar8 != 0xe);
  uVar8 = 2;
  lVar9 = 0;
  bVar4 = false;
  do {
    iVar3 = check_token_segment(ctx,(char *)((long)&parse_dcl_usage_samplerusagestrs_rel +
                                            (long)*(int *)((long)&
                                                  parse_dcl_usage_samplerusagestrs_rel + lVar9)));
    if (iVar3 != 0) {
      bVar4 = true;
LAB_001508ec:
      uVar6 = (uint)uVar8;
      bVar2 = false;
      goto LAB_001508ee;
    }
    lVar9 = lVar9 + 4;
    uVar8 = (ulong)((int)uVar8 + 1);
  } while (lVar9 != 0xc);
  bVar2 = true;
  uVar6 = 0;
LAB_001508ee:
  if ((((!bVar2) && (ctx->tokenlen != 0)) && (*ctx->token != '_')) &&
     (iVar3 = ui32fromtoken(ctx,&local_2c), iVar3 == 0)) {
    failf(ctx,"%s","Expected usage index");
  }
  parse_destination_token(ctx);
  RVar1 = (ctx->dest_arg).regtype;
  if (bVar4 == (RVar1 == REG_TYPE_SAMPLER)) {
    if (RVar1 == REG_TYPE_SAMPLER) {
      uVar7 = (uVar6 | 0xfffffff0) << 0x1b;
    }
    else {
      if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
        ctx->tokenbuf[0] = 0x80000000;
        return 3;
      }
      uVar7 = uVar6 | local_2c << 0x10 | 0x80000000;
    }
    ctx->tokenbuf[0] = uVar7;
  }
  else {
    failf(ctx,"%s","Invalid usage");
  }
  return 3;
}

Assistant:

static int parse_args_DCL(Context *ctx)
{
    int issampler = 0;
    uint32 usage = 0;
    uint32 index = 0;

    ctx->tokenbufpos++;  // save a spot for the usage/index token.
    ctx->tokenbuf[0] = 0;

    // parse_instruction_token() sets ctx->token to the end of the instruction
    //  so we can see if there are destination modifiers on the instruction
    //  itself...

    if (parse_dcl_usage(ctx, &usage, &issampler))
    {
        if ((ctx->tokenlen > 0) && (*ctx->token != '_'))
        {
            if (!ui32fromtoken(ctx, &index))
                fail(ctx, "Expected usage index");
        } // if
    } // if

    parse_destination_token(ctx);

    const int samplerreg = (ctx->dest_arg.regtype == REG_TYPE_SAMPLER);
    if (issampler != samplerreg)
        fail(ctx, "Invalid usage");
    else if (samplerreg)
        ctx->tokenbuf[0] = (usage << 27) | 0x80000000;
    else if (shader_is_pixel(ctx))  // all other pixel shader types are zero'd.
        ctx->tokenbuf[0] = 0x80000000;
    else
        ctx->tokenbuf[0] = usage | (index << 16) | 0x80000000;

    return 3;
}